

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_write_sod(opj_j2k_t *j2k,void *tile_coder)

{
  float fVar1;
  int *piVar2;
  opj_cio_t *cio_00;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  opj_cio_t *cio_01;
  long in_RSI;
  long in_RDI;
  opj_codestream_info_t *in_stack_00000030;
  int in_stack_0000003c;
  int b2;
  int b1;
  int b0;
  int plen;
  int i_1;
  int marker_end;
  int i;
  int plt_num;
  int hh;
  int ww;
  int ph;
  int pw;
  int resno;
  int compno;
  int precno;
  int marker_plt_start;
  opj_cio_t *cio;
  opj_cp_t *cp;
  opj_tcd_t *tcd;
  opj_codestream_info_t *cstr_info;
  opj_tcp_t *tcp;
  int totlen;
  int layno;
  int l;
  undefined8 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff44;
  undefined2 uVar8;
  unsigned_short in_stack_ffffffffffffff46;
  undefined2 uVar9;
  opj_codestream_info_t *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  int iVar10;
  int local_94;
  int local_8c;
  int local_78;
  int local_70;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_18;
  
  iVar10 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  iVar4 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  piVar2 = *(int **)(in_RDI + 0x60);
  cio_00 = *(opj_cio_t **)(in_RDI + 0x70);
  *(undefined4 *)(in_RSI + 4) = *(undefined4 *)(in_RDI + 0x10);
  *(undefined4 *)(in_RSI + 8) = *(undefined4 *)(in_RDI + 0x14);
  lVar3 = *(long *)(in_RDI + 0x68);
  if (lVar3 != 0) {
    local_50 = 0;
    for (local_54 = 0; local_54 < *(int *)(lVar3 + 0x34); local_54 = local_54 + 1) {
      for (local_58 = 0; local_58 <= *(int *)(*(long *)(lVar3 + 0x40) + (long)local_54 * 4);
          local_58 = local_58 + 1) {
        local_8c = 1 << ((byte)*(undefined4 *)
                                (*(long *)(*(long *)(piVar2 + 0x20) + 0x15e0) + 0x32c +
                                (long)local_58 * 4) & 0x1f);
        local_94 = 1 << ((byte)*(undefined4 *)
                                (*(long *)(*(long *)(piVar2 + 0x20) + 0x15e0) + 0x3b0 +
                                (long)local_58 * 4) & 0x1f);
        local_8c = (int)((*(int *)(lVar3 + 0x10) >> ((byte)local_58 & 0x1f)) + local_8c + -1 &
                        (local_8c - 1U ^ 0xffffffff)) / local_8c;
        local_94 = (int)((*(int *)(lVar3 + 0x14) >> ((byte)local_58 & 0x1f)) + local_94 + -1 &
                        (local_94 - 1U ^ 0xffffffff)) / local_94;
        if (local_8c < 1) {
          local_8c = 1;
        }
        if (local_94 < 1) {
          local_94 = 1;
        }
        local_50 = local_8c * local_94 + local_50;
      }
    }
    local_50 = *(int *)(lVar3 + 0x38) * local_50;
    cio_write((opj_cio_t *)in_stack_ffffffffffffff48,
              CONCAT26(in_stack_ffffffffffffff46,
                       CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)),iVar4);
    cio_write((opj_cio_t *)in_stack_ffffffffffffff48,
              CONCAT26(in_stack_ffffffffffffff46,
                       CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)),
              (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    cio_write((opj_cio_t *)in_stack_ffffffffffffff48,
              CONCAT26(in_stack_ffffffffffffff46,
                       CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)),
              (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    local_4c = cio_tell(cio_00);
    local_70 = 0;
    while( true ) {
      iVar10 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
      iVar4 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      if (SBORROW4(local_70,local_50 * 3) == local_70 + local_50 * -3 < 0) break;
      cio_write((opj_cio_t *)in_stack_ffffffffffffff48,
                CONCAT26(in_stack_ffffffffffffff46,
                         CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)),iVar4);
      local_70 = local_70 + 1;
    }
  }
  cio_write((opj_cio_t *)in_stack_ffffffffffffff48,
            CONCAT26(in_stack_ffffffffffffff46,
                     CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)),iVar4);
  if ((*(long *)(in_RDI + 0x68) != 0) && (*(int *)(in_RDI + 0x14) == 0)) {
    cio_tell(cio_00);
    j2k_add_tlmarker(iVar10,in_stack_ffffffffffffff48,in_stack_ffffffffffffff46,
                     in_stack_ffffffffffffff40,iVar4);
  }
  if (*(int *)(in_RDI + 0xc) == 0) {
    iVar4 = cio_tell(cio_00);
    *(int *)(in_RDI + 0x34) = iVar4 + *(int *)(in_RDI + 0x38);
  }
  lVar3 = *(long *)(in_RDI + 0x68);
  if (lVar3 != 0) {
    if (*(int *)(in_RDI + 0x14) == 0) {
      iVar4 = cio_tell(cio_00);
      *(int *)(*(long *)(lVar3 + 0x68) + (long)*(int *)(in_RDI + 0xc) * 0x260 + 0x10) =
           iVar4 + *(int *)(in_RDI + 0x38) + -1;
      *(undefined4 *)
       (*(long *)(*(long *)(in_RDI + 0x68) + 0x68) + (long)*(int *)(in_RDI + 0xc) * 0x260 + 8) =
           *(undefined4 *)(in_RDI + 0xc);
    }
    else {
      lVar7 = *(long *)(*(long *)(*(long *)(lVar3 + 0x68) + (long)*(int *)(in_RDI + 0xc) * 0x260 +
                                 0x228) + (long)(*(int *)(lVar3 + 8) + -1) * 0x20 + 0x10);
      iVar4 = cio_tell(cio_00);
      if (lVar7 < iVar4) {
        iVar4 = cio_tell(cio_00);
        *(long *)(*(long *)(*(long *)(lVar3 + 0x68) + (long)*(int *)(in_RDI + 0xc) * 0x260 + 0x228)
                 + (long)*(int *)(lVar3 + 8) * 0x20) = (long)iVar4;
      }
    }
  }
  lVar7 = *(long *)(piVar2 + 0x20) + (long)*(int *)(in_RDI + 0xc) * 0x15e8;
  for (local_18 = 0; local_18 < *(int *)(lVar7 + 0xc); local_18 = local_18 + 1) {
    if (*(float *)(lVar7 + 0x14 + (long)local_18 * 4) <=
        (float)(*(int *)(in_RDI + 0x34) / (piVar2[0x13] * piVar2[0x12]))) {
      fVar1 = *(float *)(lVar7 + 0x14 + (long)local_18 * 4);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        *(undefined4 *)(lVar7 + 0x14 + (long)local_18 * 4) = 0x3f800000;
      }
    }
    else {
      *(float *)(lVar7 + 0x14 + (long)local_18 * 4) =
           *(float *)(lVar7 + 0x14 + (long)local_18 * 4) -
           (float)(*(int *)(in_RDI + 0x34) / (piVar2[0x13] * piVar2[0x12]));
    }
  }
  if ((*(int *)(in_RDI + 0x14) == 0) &&
     (*(undefined4 *)(*(long *)(*(long *)(in_RSI + 0x20) + 8) + 0x350) = 0, lVar3 != 0)) {
    *(undefined4 *)(lVar3 + 8) = 0;
  }
  uVar8 = (undefined2)*(undefined4 *)(in_RDI + 0xc);
  uVar9 = (undefined2)((uint)*(undefined4 *)(in_RDI + 0xc) >> 0x10);
  cio_01 = (opj_cio_t *)cio_getbp(cio_00);
  cio_numbytesleft(cio_00);
  iVar4 = tcd_encode_tile(_i_1,plen,_b2,in_stack_0000003c,in_stack_00000030);
  iVar10 = (int)((ulong)in_RSI >> 0x20);
  lVar3 = *(long *)(in_RDI + 0x68);
  if (lVar3 != 0) {
    iVar5 = cio_tell(cio_00);
    cio_seek(cio_00,local_4c);
    for (local_78 = 0; iVar10 = (int)((ulong)in_RSI >> 0x20), local_78 < *(int *)(lVar3 + 8);
        local_78 = local_78 + 1) {
      iVar6 = ((int)*(undefined8 *)
                     (*(long *)(*(long *)(lVar3 + 0x68) + (long)*(int *)(in_RDI + 0xc) * 0x260 +
                               0x228) + (long)local_78 * 0x20 + 0x10) -
              (int)*(undefined8 *)
                    (*(long *)(*(long *)(lVar3 + 0x68) + (long)*(int *)(in_RDI + 0xc) * 0x260 +
                              0x228) + (long)local_78 * 0x20)) + 1;
      if ((iVar6 >> 0xe & 0x7fU) == 0) {
        if ((iVar6 >> 7 & 0x7fU) != 0) {
          cio_write(cio_01,CONCAT26(uVar9,CONCAT24(uVar8,in_stack_ffffffffffffff40)),iVar10);
        }
      }
      else {
        cio_write(cio_01,CONCAT26(uVar9,CONCAT24(uVar8,in_stack_ffffffffffffff40)),iVar10);
        cio_write(cio_01,CONCAT26(uVar9,CONCAT24(uVar8,in_stack_ffffffffffffff40)),
                  (int)((ulong)in_RSI >> 0x20));
      }
      cio_write(cio_01,CONCAT26(uVar9,CONCAT24(uVar8,in_stack_ffffffffffffff40)),
                (int)((ulong)in_RSI >> 0x20));
    }
    cio_seek(cio_00,iVar5);
  }
  iVar5 = cio_tell(cio_00);
  iVar4 = (iVar5 + iVar4) - *(int *)(in_RDI + 0x30);
  cio_seek(cio_00,*(int *)(in_RDI + 0x30) + 6);
  cio_write(cio_01,CONCAT26(uVar9,CONCAT24(uVar8,in_stack_ffffffffffffff40)),iVar10);
  cio_seek(cio_00,*(int *)(in_RDI + 0x30) + iVar4);
  if (*piVar2 != 0) {
    cio_seek(cio_00,*(int *)(in_RDI + 0x20) + 6 + *(int *)(in_RDI + 0x14) * 5);
    cio_write(cio_01,CONCAT26(uVar9,CONCAT24(uVar8,in_stack_ffffffffffffff40)),iVar10);
    cio_write(cio_01,CONCAT26(uVar9,CONCAT24(uVar8,in_stack_ffffffffffffff40)),iVar10);
  }
  cio_seek(cio_00,*(int *)(in_RDI + 0x30) + iVar4);
  return;
}

Assistant:

static void j2k_write_sod(opj_j2k_t *j2k, void *tile_coder) {
	int l, layno;
	int totlen;
	opj_tcp_t *tcp = NULL;
	opj_codestream_info_t *cstr_info = NULL;
	
	opj_tcd_t *tcd = (opj_tcd_t*)tile_coder;	/* cast is needed because of conflicts in header inclusions */
	opj_cp_t *cp = j2k->cp;
	opj_cio_t *cio = j2k->cio;

	tcd->tp_num = j2k->tp_num ;
	tcd->cur_tp_num = j2k->cur_tp_num;
	
	/* INDEX >> - PLT */
#define ROUND_UPTO(a, quanta)   (((a) + ((quanta) - 1)) & ~((quanta) - 1))
	int marker_plt_start;
	cstr_info = j2k->cstr_info;
	if (cstr_info) {
		int precno = 0;
		for (int compno = 0; compno < cstr_info->numcomps; compno++)
			for (int resno = 0; resno <= cstr_info->numdecompos[compno]; resno++) {
				int pw = 1 << cp->tcps->tccps->prcw[resno];
				int ph = 1 << cp->tcps->tccps->prch[resno];

				int ww = (cstr_info->image_w >> resno);
				ww = ROUND_UPTO(ww, pw) / pw;

				int hh = (cstr_info->image_h >> resno);
				hh = ROUND_UPTO(hh, ph) / ph;

				precno += (ww < 1 ? 1 : ww) * (hh < 1 ? 1 : hh);
			}
		int plt_num = cstr_info->numlayers * precno;

		cio_write(cio, J2K_MS_PLT, 2);
		cio_write(cio, plt_num * 3 + 2 + 1, 2);
		cio_write(cio, 0, 1);

		marker_plt_start = cio_tell(cio);
		for (int i = 0; i < plt_num * 3; ++i)
            cio_write(cio, 0, 1);
	}
	/* PLT - << INDEX */
	
	cio_write(cio, J2K_MS_SOD, 2);

	if( j2k->cstr_info && j2k->cur_tp_num==0){
	  j2k_add_tlmarker( j2k->curtileno, j2k->cstr_info, J2K_MS_SOD, cio_tell(cio), 0);
	}

	if (j2k->curtileno == 0) {
		j2k->sod_start = cio_tell(cio) + j2k->pos_correction;
	}

	/* INDEX >> */
	cstr_info = j2k->cstr_info;
	if (cstr_info) {
		if (!j2k->cur_tp_num ) {
			cstr_info->tile[j2k->curtileno].end_header = cio_tell(cio) + j2k->pos_correction - 1;
			j2k->cstr_info->tile[j2k->curtileno].tileno = j2k->curtileno;
		}
		else{
			if(cstr_info->tile[j2k->curtileno].packet[cstr_info->packno - 1].end_pos < cio_tell(cio))
				cstr_info->tile[j2k->curtileno].packet[cstr_info->packno].start_pos = cio_tell(cio);
		}
		/* UniPG>> */
#ifdef USE_JPWL
		/* update markers struct */
		j2k_add_marker(j2k->cstr_info, J2K_MS_SOD, j2k->sod_start, 2);
#endif /* USE_JPWL */
		/* <<UniPG */
	}
	/* << INDEX */
	
	tcp = &cp->tcps[j2k->curtileno];
	for (layno = 0; layno < tcp->numlayers; layno++) {
		if (tcp->rates[layno]>(j2k->sod_start / (cp->th * cp->tw))) {
			tcp->rates[layno]-=(j2k->sod_start / (cp->th * cp->tw));
		} else if (tcp->rates[layno]) {
			tcp->rates[layno]=1;
		}
	}
	if(j2k->cur_tp_num == 0){
		tcd->tcd_image->tiles->packno = 0;
		if(cstr_info)
			cstr_info->packno = 0;
	}
	
	l = tcd_encode_tile(tcd, j2k->curtileno, cio_getbp(cio), cio_numbytesleft(cio) - 2, cstr_info);
	
	/* INDEX >> - PLT */
	cstr_info = j2k->cstr_info;
	if (cstr_info) {
		int marker_end = cio_tell(cio);
		cio_seek(cio, marker_plt_start);
		for (int i = 0; i < cstr_info->packno; ++i) {
			int plen = cstr_info->tile[j2k->curtileno].packet[i].end_pos - cstr_info->tile[j2k->curtileno].packet[i].start_pos + 1;

			int b0 = plen & 0x7F;
			int b1 = (plen >> 7) & 0x7F;
			int b2 = (plen >> 14) & 0x7F;

			if (b2) {
				cio_write(cio, b2 | 0x80, 1);
				cio_write(cio, b1 | 0x80, 1);
			} else if (b1)
				cio_write(cio, b1 | 0x80, 1);
			cio_write(cio, b0, 1);
		}
		cio_seek(cio, marker_end);
	}
	/* PLT - << INDEX */
	
	/* Writing Psot in SOT marker */
	totlen = cio_tell(cio) + l - j2k->sot_start;
	cio_seek(cio, j2k->sot_start + 6);
	cio_write(cio, totlen, 4);
	cio_seek(cio, j2k->sot_start + totlen);
	/* Writing Ttlm and Ptlm in TLM marker */
	if(cp->cinema){
		cio_seek(cio, j2k->tlm_start + 6 + (5*j2k->cur_tp_num));
		cio_write(cio, j2k->curtileno, 1);
		cio_write(cio, totlen, 4);
	}
	cio_seek(cio, j2k->sot_start + totlen);
}